

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

TestCase * __thiscall
testing::internal::UnitTestImpl::GetTestCase
          (UnitTestImpl *this,char *test_case_name,char *type_param,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppTVar2;
  int iVar3;
  __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  __last;
  iterator __position;
  iterator __position_00;
  bool bVar4;
  __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  _Var5;
  TestCase *this_00;
  TestCaseNameIs local_98;
  TearDownTestCaseFunc local_78;
  SetUpTestCaseFunc local_70;
  char *local_68;
  string local_60;
  TestCase *local_40;
  TestCase *new_test_case;
  
  _Var5._M_current =
       (this->test_cases_).
       super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->test_cases_).
       super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_78 = tear_down_tc;
  local_70 = set_up_tc;
  local_68 = type_param;
  std::__cxx11::string::string((string *)&local_60,test_case_name,(allocator *)&local_40);
  paVar1 = &local_98.name_.field_2;
  local_98.name_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,
             CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p),
             local_60._M_string_length +
             CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p));
  _Var5 = std::
          find_if<__gnu_cxx::__normal_iterator<testing::TestCase**,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>,testing::internal::TestCaseNameIs>
                    (_Var5,__last,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.name_._M_dataplus._M_p,local_98.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p),
                    local_60.field_2._M_allocated_capacity + 1);
  }
  if (_Var5._M_current ==
      (this->test_cases_).
      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = (TestCase *)operator_new(0xf8);
    TestCase::TestCase(this_00,test_case_name,local_68,local_70,local_78);
    local_40 = this_00;
    std::__cxx11::string::string
              ((string *)&local_60,test_case_name,(allocator *)((long)&new_test_case + 7));
    bVar4 = UnitTestOptions::MatchesFilter(&local_60,"*DeathTest:*DeathTest/*");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p),
                      local_60.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      iVar3 = this->last_death_test_case_;
      this->last_death_test_case_ = iVar3 + 1;
      std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::insert
                (&this->test_cases_,
                 (const_iterator)
                 ((this->test_cases_).
                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                  _M_impl.super__Vector_impl_data._M_start + (long)iVar3 + 1),&local_40);
    }
    else {
      __position._M_current =
           (this->test_cases_).
           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->test_cases_).
          super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>::
        _M_realloc_insert<testing::TestCase*const&>
                  ((vector<testing::TestCase*,std::allocator<testing::TestCase*>> *)
                   &this->test_cases_,__position,&local_40);
      }
      else {
        *__position._M_current = this_00;
        pppTVar2 = &(this->test_cases_).
                    super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
    }
    __position_00._M_current =
         (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_60._M_dataplus._M_p._0_4_ =
         (int)((ulong)((long)__position_00._M_current -
                      (long)(this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2);
    if (__position_00._M_current ==
        (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->test_case_indices_,__position_00,(int *)&local_60);
    }
    else {
      *__position_00._M_current = (int)local_60._M_dataplus._M_p;
      (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position_00._M_current + 1;
    }
  }
  else {
    local_40 = *_Var5._M_current;
  }
  return local_40;
}

Assistant:

TestCase* UnitTestImpl::GetTestCase(const char* test_case_name,
                                    const char* type_param,
                                    Test::SetUpTestCaseFunc set_up_tc,
                                    Test::TearDownTestCaseFunc tear_down_tc) {
  // Can we find a TestCase with the given name?
  const std::vector<TestCase*>::const_iterator test_case =
      std::find_if(test_cases_.begin(), test_cases_.end(),
                   TestCaseNameIs(test_case_name));

  if (test_case != test_cases_.end())
    return *test_case;

  // No.  Let's create one.
  TestCase* const new_test_case =
      new TestCase(test_case_name, type_param, set_up_tc, tear_down_tc);

  // Is this a death test case?
  if (internal::UnitTestOptions::MatchesFilter(test_case_name,
                                               kDeathTestCaseFilter)) {
    // Yes.  Inserts the test case after the last death test case
    // defined so far.  This only works when the test cases haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_case_;
    test_cases_.insert(test_cases_.begin() + last_death_test_case_,
                       new_test_case);
  } else {
    // No.  Appends to the end of the list.
    test_cases_.push_back(new_test_case);
  }

  test_case_indices_.push_back(static_cast<int>(test_case_indices_.size()));
  return new_test_case;
}